

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

char * uvTypeName(VType t)

{
  char *pcVar1;
  long in_FS_OFFSET;
  
  if (t < (VNUM|VARR)) {
    pcVar1 = *(char **)(&DAT_006c09a8 + (ulong)t * 8);
  }
  else {
    pcVar1 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pcVar1;
  }
  __stack_chk_fail();
}

Assistant:

const char *uvTypeName(UniValue::VType t)
{
    switch (t) {
    case UniValue::VNULL: return "null";
    case UniValue::VBOOL: return "bool";
    case UniValue::VOBJ: return "object";
    case UniValue::VARR: return "array";
    case UniValue::VSTR: return "string";
    case UniValue::VNUM: return "number";
    }

    // not reached
    return nullptr;
}